

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> __thiscall
slang::ast::Compilation::getAttributes(Compilation *this,void *ptr)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  group_type_pointer pgVar3;
  ulong uVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  ulong uVar7;
  long lVar8;
  pointer ppAVar9;
  ulong uVar10;
  __extent_storage<18446744073709551615UL> _Var11;
  uint uVar12;
  value_type_pointer ppVar13;
  value_type *elements;
  ulong uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  undefined1 auVar19 [16];
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar20;
  
  auVar6._8_8_ = 0;
  auVar6._0_8_ = ptr;
  uVar10 = SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar6 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar7 = uVar10 >> ((byte)(this->attributeMap).table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
                           .arrays.groups_size_index & 0x3f);
  pgVar3 = (this->attributeMap).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
           .arrays.groups_;
  uVar2 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar10 & 0xff];
  ppVar13 = (this->attributeMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
            .arrays.elements_;
  uVar4 = (this->attributeMap).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_void_*,_std::span<const_slang::ast::AttributeSymbol_*const>_>,_slang::hash<const_void_*>,_std::equal_to<const_void_*>,_std::allocator<std::pair<const_void_*const,_std::span<const_slang::ast::AttributeSymbol_*const>_>_>_>
          .arrays.groups_size_mask;
  uVar14 = 0;
  do {
    pgVar1 = pgVar3 + uVar7;
    uVar15 = (uchar)uVar2;
    auVar19[0] = -(pgVar1->m[0].n == uVar15);
    uVar16 = (uchar)((uint)uVar2 >> 8);
    auVar19[1] = -(pgVar1->m[1].n == uVar16);
    uVar17 = (uchar)((uint)uVar2 >> 0x10);
    auVar19[2] = -(pgVar1->m[2].n == uVar17);
    uVar18 = (uchar)((uint)uVar2 >> 0x18);
    auVar19[3] = -(pgVar1->m[3].n == uVar18);
    auVar19[4] = -(pgVar1->m[4].n == uVar15);
    auVar19[5] = -(pgVar1->m[5].n == uVar16);
    auVar19[6] = -(pgVar1->m[6].n == uVar17);
    auVar19[7] = -(pgVar1->m[7].n == uVar18);
    auVar19[8] = -(pgVar1->m[8].n == uVar15);
    auVar19[9] = -(pgVar1->m[9].n == uVar16);
    auVar19[10] = -(pgVar1->m[10].n == uVar17);
    auVar19[0xb] = -(pgVar1->m[0xb].n == uVar18);
    auVar19[0xc] = -(pgVar1->m[0xc].n == uVar15);
    auVar19[0xd] = -(pgVar1->m[0xd].n == uVar16);
    auVar19[0xe] = -(pgVar1->m[0xe].n == uVar17);
    auVar19[0xf] = -(pgVar1->m[0xf].n == uVar18);
    for (uVar12 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe); uVar12 != 0;
        uVar12 = uVar12 - 1 & uVar12) {
      uVar5 = 0;
      if (uVar12 != 0) {
        for (; (uVar12 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
        }
      }
      if (ppVar13[uVar7 * 0xf + (ulong)uVar5].first == ptr) {
        ppVar13 = ppVar13 + uVar7 * 0xf + (ulong)uVar5;
        goto LAB_001442f2;
      }
    }
    if ((pgVar3[uVar7].m[0xf].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[(uint)uVar10 & 7]) == 0) break;
    lVar8 = uVar7 + uVar14;
    uVar14 = uVar14 + 1;
    uVar7 = lVar8 + 1U & uVar4;
  } while (uVar14 <= uVar4);
  ppVar13 = (value_type_pointer)0x0;
LAB_001442f2:
  if (ppVar13 == (value_type_pointer)0x0) {
    ppAVar9 = (pointer)0x0;
    _Var11._M_extent_value = 0;
  }
  else {
    ppAVar9 = (ppVar13->second)._M_ptr;
    _Var11._M_extent_value = (ppVar13->second)._M_extent._M_extent_value;
  }
  sVar20._M_extent._M_extent_value = _Var11._M_extent_value;
  sVar20._M_ptr = ppAVar9;
  return sVar20;
}

Assistant:

std::span<const AttributeSymbol* const> Compilation::getAttributes(const void* ptr) const {
    auto it = attributeMap.find(ptr);
    if (it == attributeMap.end())
        return {};

    return it->second;
}